

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O0

void from_locale(char *buffer)

{
  lconv *plVar1;
  char *pcVar2;
  char *pos;
  char *point;
  char *buffer_local;
  
  plVar1 = localeconv();
  if ((*plVar1->decimal_point != '.') &&
     (pcVar2 = strchr(buffer,(int)*plVar1->decimal_point), pcVar2 != (char *)0x0)) {
    *pcVar2 = '.';
  }
  return;
}

Assistant:

static void from_locale(char *buffer) {
    const char *point;
    char *pos;

    point = localeconv()->decimal_point;
    if (*point == '.') {
        /* No conversion needed */
        return;
    }

    pos = strchr(buffer, *point);
    if (pos)
        *pos = '.';
}